

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::Generate
          (MessageBuilderGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  Printer *this_00;
  MessageBuilderGenerator *pMVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  long lVar6;
  ImmutableFieldGenerator *pIVar7;
  long lVar8;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  ulong uVar9;
  ulong extraout_RDX;
  int i_1;
  int iVar10;
  char *text;
  int i;
  long lVar11;
  java *this_01;
  allocator<char> local_b1;
  Printer *local_b0;
  MessageBuilderGenerator *local_a8;
  string local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_50;
  
  WriteMessageDocComment(printer,this->descriptor_);
  pDVar1 = this->descriptor_;
  if (*(int *)(pDVar1 + 0x68) < 1) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&vars,this->name_resolver_,pDVar1);
    ExtraBuilderInterfaces_abi_cxx11_(&local_a0,(java *)this->descriptor_,descriptor_00);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::Print(printer,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                       ,"classname",(string *)&vars,"extra_interfaces",&local_a0,"ver",&local_50);
  }
  else {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&vars,this->name_resolver_,pDVar1);
    ExtraBuilderInterfaces_abi_cxx11_(&local_a0,(java *)this->descriptor_,descriptor);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::Print(printer,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                       ,"classname",(string *)&vars,"extra_interfaces",&local_a0,"ver",&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&vars);
  io::Printer::Indent(printer);
  GenerateDescriptorMethods(this,printer);
  GenerateCommonBuilderMethods(this,printer);
  bVar3 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
  if (bVar3) {
    GenerateIsInitialized(this,printer);
    GenerateBuilderParsingMethods(this,printer);
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar11 = 0;
  lVar8 = 0;
  local_b0 = printer;
  local_a8 = this;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pMVar2 = local_a8;
    pDVar1 = local_a8->descriptor_;
    if (*(int *)(pDVar1 + 0x38) <= lVar8) break;
    Context::GetOneofGeneratorInfo
              (local_a8->context_,(OneofDescriptor *)(*(long *)(pDVar1 + 0x40) + lVar11));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"oneof_name",(allocator<char> *)&local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a0);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_a0);
    Context::GetOneofGeneratorInfo
              (local_a8->context_,
               (OneofDescriptor *)(*(long *)(local_a8->descriptor_ + 0x40) + lVar11));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"oneof_capitalized_name",(allocator<char> *)&local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a0);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_a0);
    lVar6 = (*(long *)(local_a8->descriptor_ + 0x40) -
            *(long *)(*(long *)(*(long *)(local_a8->descriptor_ + 0x40) + 0x10 + lVar11) + 0x40)) +
            lVar11;
    SimpleItoa_abi_cxx11_(&local_a0,(protobuf *)(lVar6 / 0x30 & 0xffffffff),(int)(lVar6 % 0x30));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"oneof_index",&local_b1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_50);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a0);
    io::Printer::Print(local_b0,&vars,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(local_b0,&vars,
                       "public $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n"
                      );
    io::Printer::Print(local_b0,"  onChanged();\n");
    io::Printer::Print(local_b0,"  return this;\n}\n\n");
    lVar8 = lVar8 + 1;
    lVar11 = lVar11 + 0x30;
  }
  bVar3 = anon_unknown_10::GenerateHasBits(pDVar1);
  this_00 = local_b0;
  if (bVar3) {
    lVar8 = 0;
    iVar10 = 0;
    for (lVar11 = 0; lVar11 < *(int *)(pMVar2->descriptor_ + 0x2c); lVar11 = lVar11 + 1) {
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&pMVar2->field_generators_,
                          (FieldDescriptor *)(*(long *)(pMVar2->descriptor_ + 0x30) + lVar8));
      iVar4 = (*pIVar7->_vptr_ImmutableFieldGenerator[3])(pIVar7);
      iVar10 = iVar10 + iVar4;
      lVar8 = lVar8 + 0xa8;
    }
    iVar4 = (iVar10 + 0x1f) / 0x20;
    uVar9 = (long)(iVar10 + 0x1f) % 0x20 & 0xffffffff;
    this_01 = (java *)0x0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
      GetBitFieldName_abi_cxx11_(&local_a0,this_01,(int)uVar9);
      io::Printer::Print(this_00,"private int $bit_field_name$;\n","bit_field_name",&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      uVar9 = extraout_RDX;
    }
  }
  lVar11 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(pMVar2->descriptor_ + 0x2c); lVar8 = lVar8 + 1) {
    io::Printer::Print(this_00,"\n");
    pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&pMVar2->field_generators_,
                        (FieldDescriptor *)(*(long *)(pMVar2->descriptor_ + 0x30) + lVar11));
    (*pIVar7->_vptr_ImmutableFieldGenerator[6])(pIVar7,this_00);
    lVar11 = lVar11 + 0xa8;
  }
  text = 
  "public final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.setUnknownFields(unknownFields);\n}\n\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.mergeUnknownFields(unknownFields);\n}\n\n"
  ;
  if (*(int *)(*(long *)(pMVar2->descriptor_ + 0x10) + 0x8c) == 3) {
    text = 
    "public final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return this;\n}\n\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return this;\n}\n\n"
    ;
  }
  io::Printer::Print(this_00,text);
  io::Printer::Print(this_00,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
                     "full_name",*(string **)(pMVar2->descriptor_ + 8));
  io::Printer::Outdent(this_00);
  io::Printer::Print(this_00,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageBuilderGenerator::
Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n"
      "      $classname$, Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_),
      "ver", GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_),
      "ver", GeneratedCodeVersionSuffix());
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateBuilderParsingMethods(printer);
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->capitalized_name;
    vars["oneof_index"] = SimpleItoa(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // oneofCase() and clearOneof()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "    get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n"
      "public Builder clear$oneof_capitalized_name$() {\n"
      "  $oneof_name$Case_ = 0;\n"
      "  $oneof_name$_ = null;\n");
    printer->Print("  onChanged();\n");
    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForBuilder();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
                     .GenerateBuilderMembers(printer);
  }

  if (!PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return this;\n"
      "}\n"
      "\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return this;\n"
      "}\n"
      "\n");
  } else {
    // Override methods declared in GeneratedMessage to return the concrete
    // generated type so callsites won't depend on GeneratedMessage. This
    // is needed to keep binary compatibility when we change generated code
    // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
    // we changed all generated code to subclass GeneratedMessageV3).
    printer->Print(
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.setUnknownFields(unknownFields);\n"
      "}\n"
      "\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.mergeUnknownFields(unknownFields);\n"
      "}\n"
      "\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}